

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void gen_add_insn_before(gen_ctx_t gen_ctx,MIR_insn_t before,MIR_insn_t insn)

{
  int iVar1;
  MIR_insn_t insn_for_bb;
  
  iVar1 = *(int *)&insn->field_0x18;
  if ((((iVar1 != 0xb4) && (iVar1 != 0xaa)) && (iVar1 != 0xa6)) && (0x2e < iVar1 - 0x76U)) {
    insn_for_bb = before;
    if (*(int *)&before->field_0x18 == 0xb4) {
      insn_for_bb = (before->insn_link).prev;
      if (insn_for_bb == (MIR_insn_t)0x0) {
        insn_for_bb = (MIR_insn_t)0x0;
      }
      else {
        iVar1 = (int)*(undefined8 *)&insn_for_bb->field_0x18;
        if (((0xffffffd0 < iVar1 - 0xa5U) || (iVar1 == 0xaa)) || (iVar1 == 0xa6)) {
          __assert_fail("insn_for_bb == ((void*)0) || !MIR_any_branch_code_p (insn_for_bb->code)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x2b2,"void gen_add_insn_before(gen_ctx_t, MIR_insn_t, MIR_insn_t)");
        }
      }
    }
    MIR_insert_insn_before(gen_ctx->ctx,gen_ctx->curr_func_item,before,insn);
    create_new_bb_insns(gen_ctx,(insn->insn_link).prev,before,insn_for_bb);
    return;
  }
  __assert_fail("!MIR_any_branch_code_p (insn->code) && insn->code != MIR_LABEL",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2af,"void gen_add_insn_before(gen_ctx_t, MIR_insn_t, MIR_insn_t)");
}

Assistant:

static void gen_add_insn_before (gen_ctx_t gen_ctx, MIR_insn_t before, MIR_insn_t insn) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_insn_t insn_for_bb = before;

  gen_assert (!MIR_any_branch_code_p (insn->code) && insn->code != MIR_LABEL);
  if (before->code == MIR_LABEL) {
    insn_for_bb = DLIST_PREV (MIR_insn_t, before);
    gen_assert (insn_for_bb == NULL || !MIR_any_branch_code_p (insn_for_bb->code));
  }
  MIR_insert_insn_before (ctx, curr_func_item, before, insn);
  create_new_bb_insns (gen_ctx, DLIST_PREV (MIR_insn_t, insn), before, insn_for_bb);
}